

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

tuple<glslang::TBasicType,_glslang::TBasicType> __thiscall
glslang::TIntermediate::getConversionDestinationType
          (TIntermediate *this,TBasicType type0,TBasicType type1,TOperator op)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  EShLanguage EVar4;
  EShLanguage EVar5;
  uint uVar6;
  uint uVar7;
  TBasicType uintType;
  undefined4 in_register_00000034;
  TIntermediate *this_00;
  uint uVar8;
  TOperator in_R8D;
  
  this_00 = (TIntermediate *)CONCAT44(in_register_00000034,type0);
  if (this_00->profile == EEsProfile) {
    if (0x135 < this_00->version) {
      EVar5 = 0x1c;
      EVar4 = 0x1c;
      if (((this_00->numericFeatures).features & 0x100) == 0) goto LAB_00496321;
      goto LAB_004960cf;
    }
  }
  else {
    EVar5 = 0x1c;
    EVar4 = 0x1c;
    if (this_00->version == 0x6e) goto LAB_00496321;
LAB_004960cf:
    if (this_00->source == EShSourceHlsl) {
      bVar1 = canImplicitlyPromote(this_00,op,type1,in_R8D);
      EVar5 = type1;
      EVar4 = type1;
      if (!bVar1) {
        bVar1 = canImplicitlyPromote(this_00,type1,op,in_R8D);
        EVar5 = 0x1c;
        EVar4 = 0x1c;
        if (bVar1) {
          EVar5 = op;
          EVar4 = op;
        }
      }
      goto LAB_00496321;
    }
    if (type1 == EbtDouble) {
      bVar1 = canImplicitlyPromote(this_00,op,EbtDouble,in_R8D);
      EVar5 = EShLangTessEvaluation;
      EVar4 = EShLangTessEvaluation;
      if (bVar1) goto LAB_00496321;
    }
    if (op == EOpScope) {
      bVar1 = canImplicitlyPromote(this_00,type1,EbtDouble,in_R8D);
      EVar5 = EShLangTessEvaluation;
      EVar4 = EShLangTessEvaluation;
      if (bVar1) goto LAB_00496321;
    }
    if (type1 == EbtFloat) {
      bVar1 = canImplicitlyPromote(this_00,op,EbtFloat,in_R8D);
      EVar5 = EShLangTessControl;
      EVar4 = EShLangTessControl;
      if (bVar1) goto LAB_00496321;
    }
    if (op == EOpSequence) {
      bVar1 = canImplicitlyPromote(this_00,type1,EbtFloat,in_R8D);
      EVar5 = EShLangTessControl;
      EVar4 = EShLangTessControl;
      if (bVar1) goto LAB_00496321;
    }
    if (type1 == EbtFloat16) {
      bVar1 = canImplicitlyPromote(this_00,op,EbtFloat16,in_R8D);
      EVar5 = EShLangGeometry;
      EVar4 = EShLangGeometry;
      if (bVar1) goto LAB_00496321;
    }
    if (op == EOpLinkerObjects) {
      bVar1 = canImplicitlyPromote(this_00,type1,EbtFloat16,in_R8D);
      EVar5 = EShLangGeometry;
      EVar4 = EShLangGeometry;
      if (bVar1) goto LAB_00496321;
    }
    uVar6 = type1 - EbtInt8;
    if ((uVar6 & 0xfffffff9) == 0 || (type1 - EbtUint8 & 0xfffffff9) == 0) {
      uVar7 = op - EOpFunctionCall;
      uVar8 = op - EOpFunction;
      if (((uVar7 & 0xfffffff9) == 0 || (uVar8 & 0xfffffff9) == 0) &&
         ((bVar1 = canImplicitlyPromote(this_00,type1,op,in_R8D), bVar1 ||
          (bVar1 = canImplicitlyPromote(this_00,op,type1,in_R8D), bVar1)))) {
        if (((uVar7 | uVar6) & 0xfffffff9) == 0) {
LAB_00496389:
          iVar2 = getTypeRank(type1);
          iVar3 = getTypeRank(op);
          EVar5 = type1;
          EVar4 = type1;
          if (iVar2 < iVar3) {
            EVar5 = op;
            EVar4 = op;
          }
        }
        else {
          if ((type1 - EbtUint8 & 0xfffffff9) == 0) {
            if ((uVar8 & 0xfffffff9) == 0) goto LAB_00496389;
            iVar2 = getTypeRank(type1);
            iVar3 = getTypeRank(op);
            EVar5 = type1;
            EVar4 = type1;
            if (iVar3 < iVar2) goto LAB_00496321;
          }
          else if ((uVar8 & 0xfffffff9) == 0) {
            iVar2 = getTypeRank(op);
            iVar3 = getTypeRank(type1);
            EVar5 = op;
            EVar4 = op;
            if (iVar3 < iVar2) goto LAB_00496321;
          }
          uintType = op;
          if ((((uVar6 & 0xfffffff9) == 0) ||
              (EVar5 = 0x1c, EVar4 = 0x1c, uintType = type1, type1 = op, (uVar7 & 0xfffffff9) == 0))
             && (bVar1 = canSignedIntTypeRepresentAllUnsignedValues(type1,uintType), EVar5 = type1,
                EVar4 = type1, !bVar1)) {
            EVar4 = getCorrespondingUnsignedType(type1);
            EVar5 = getCorrespondingUnsignedType(type1);
          }
        }
        goto LAB_00496321;
      }
    }
  }
  EVar5 = 0x1c;
  EVar4 = 0x1c;
LAB_00496321:
  this->language = EVar5;
  *(EShLanguage *)&this->field_0x4 = EVar4;
  return (tuple<glslang::TBasicType,_glslang::TBasicType>)
         (_Tuple_impl<0UL,_glslang::TBasicType,_glslang::TBasicType>)this;
}

Assistant:

std::tuple<TBasicType, TBasicType> TIntermediate::getConversionDestinationType(TBasicType type0, TBasicType type1, TOperator op) const
{
    TBasicType res0 = EbtNumTypes;
    TBasicType res1 = EbtNumTypes;

    if ((isEsProfile() && 
        (version < 310 || !numericFeatures.contains(TNumericFeatures::shader_implicit_conversions))) || 
        version == 110)
        return std::make_tuple(res0, res1);

    if (getSource() == EShSourceHlsl) {
        if (canImplicitlyPromote(type1, type0, op)) {
            res0 = type0;
            res1 = type0;
        } else if (canImplicitlyPromote(type0, type1, op)) {
            res0 = type1;
            res1 = type1;
        }
        return std::make_tuple(res0, res1);
    }

    if ((type0 == EbtDouble && canImplicitlyPromote(type1, EbtDouble, op)) ||
        (type1 == EbtDouble && canImplicitlyPromote(type0, EbtDouble, op)) ) {
        res0 = EbtDouble;
        res1 = EbtDouble;
    } else if ((type0 == EbtFloat && canImplicitlyPromote(type1, EbtFloat, op)) ||
               (type1 == EbtFloat && canImplicitlyPromote(type0, EbtFloat, op)) ) {
        res0 = EbtFloat;
        res1 = EbtFloat;
    } else if ((type0 == EbtFloat16 && canImplicitlyPromote(type1, EbtFloat16, op)) ||
               (type1 == EbtFloat16 && canImplicitlyPromote(type0, EbtFloat16, op)) ) {
        res0 = EbtFloat16;
        res1 = EbtFloat16;
    } else if (isTypeInt(type0) && isTypeInt(type1) &&
               (canImplicitlyPromote(type0, type1, op) || canImplicitlyPromote(type1, type0, op))) {
        if ((isTypeSignedInt(type0) && isTypeSignedInt(type1)) ||
            (isTypeUnsignedInt(type0) && isTypeUnsignedInt(type1))) {
            if (getTypeRank(type0) < getTypeRank(type1)) {
                res0 = type1;
                res1 = type1;
            } else {
                res0 = type0;
                res1 = type0;
            }
        } else if (isTypeUnsignedInt(type0) && (getTypeRank(type0) > getTypeRank(type1))) {
            res0 = type0;
            res1 = type0;
        } else if (isTypeUnsignedInt(type1) && (getTypeRank(type1) > getTypeRank(type0))) {
            res0 = type1;
            res1 = type1;
        } else if (isTypeSignedInt(type0)) {
            if (canSignedIntTypeRepresentAllUnsignedValues(type0, type1)) {
                res0 = type0;
                res1 = type0;
            } else {
                res0 = getCorrespondingUnsignedType(type0);
                res1 = getCorrespondingUnsignedType(type0);
            }
        } else if (isTypeSignedInt(type1)) {
            if (canSignedIntTypeRepresentAllUnsignedValues(type1, type0)) {
                res0 = type1;
                res1 = type1;
            } else {
                res0 = getCorrespondingUnsignedType(type1);
                res1 = getCorrespondingUnsignedType(type1);
            }
        }
    }

    return std::make_tuple(res0, res1);
}